

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_0::BufferPreservedTest::iterate(BufferPreservedTest *this)

{
  TestLog *log;
  deUint32 dVar1;
  EGLBoolean got;
  Library *egl;
  int bufferAge;
  CallLogWrapper wrapper;
  EGLint damageRegion [4];
  undefined4 local_9c;
  ScopedLogSection local_98;
  string local_90;
  string local_70;
  CallLogWrapper local_50;
  EGLint local_38 [4];
  
  egl = EglTestContext::getLibrary
                  ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  log = ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  eglu::CallLogWrapper::CallLogWrapper(&local_50,egl,log);
  local_38[0] = 10;
  local_38[1] = 10;
  local_38[2] = 10;
  local_38[3] = 10;
  local_9c = 0xffffffff;
  local_50.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Test3","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"If buffer_preserved --> EGL_BAD_MATCH","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,log,&local_70,&local_90);
  tcu::TestLog::endSection(local_98.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3094);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x179);
  (*egl->_vptr_Library[0x2b])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&local_9c);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,"querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x17a);
  got = eglu::CallLogWrapper::eglSetDamageRegionKHR
                  (&local_50,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                   (this->super_NegativePartialUpdateTest).m_eglSurface,local_38,1);
  NegativePartialUpdateTest::expectBoolean(&this->super_NegativePartialUpdateTest,0,got);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  eglu::CallLogWrapper::~CallLogWrapper(&local_50);
  return STOP;
}

Assistant:

TestCase::IterateResult BufferPreservedTest::iterate (void)
{
	const Library&			egl				= m_eglTestCtx.getLibrary();
	TestLog&				log				= m_testCtx.getLog();
	CallLogWrapper			wrapper			(egl, log);
	EGLint					damageRegion[]	= { 10, 10, 10, 10 };
	int						bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	{
		tcu::ScopedLogSection(log, "Test3", "If buffer_preserved --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));
		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, DE_LENGTH_OF_ARRAY(damageRegion)/4));
		expectError(EGL_BAD_MATCH);
	}

	return STOP;
}